

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O1

void Map_NodeVecPush(Map_NodeVec_t *p,Map_Node_t *Entry)

{
  int iVar1;
  int nCapMin;
  
  iVar1 = p->nCap;
  if (p->nSize == iVar1) {
    nCapMin = 0x10;
    if (0xf < iVar1) {
      nCapMin = iVar1 * 2;
    }
    Map_NodeVecGrow(p,nCapMin);
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

void Map_NodeVecPush( Map_NodeVec_t * p, Map_Node_t * Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Map_NodeVecGrow( p, 16 );
        else
            Map_NodeVecGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}